

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value)

{
  buffer_appender<char> bVar1;
  buffer_appender<char> in_RDI;
  buffer_appender<char> it;
  buffer_appender<char> *in_stack_ffffffffffffffb8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *in_stack_ffffffffffffffc0;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffd0;
  
  bVar1 = reserve<char>(in_RDI,(size_t)in_stack_ffffffffffffffd0.container);
  buffer_appender<char>::operator++(in_stack_ffffffffffffffb8,0);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
            ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&stack0xffffffffffffffd0);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
            (in_stack_ffffffffffffffc0,(value_type_conflict1 *)in_stack_ffffffffffffffb8);
  bVar1 = base_iterator<fmt::v7::detail::buffer_appender<char>>(in_RDI,bVar1);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write(OutputIt out, Char value) {
  auto it = reserve(out, 1);
  *it++ = value;
  return base_iterator(out, it);
}